

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<yb::PrintBuffer_const&>::
captureExpression<(Catch::Internal::Operator)0,char[18]>
          (ExpressionLhs<yb::PrintBuffer_const&> *this,char (*rhs) [18])

{
  bool result;
  ResultBuilder *pRVar1;
  char *value;
  string local_88;
  string local_68;
  string local_48;
  allocator<char> local_21;
  
  pRVar1 = *(ResultBuilder **)this;
  result = (bool)yb::PrintBuffer::operator==(*(PrintBuffer **)(this + 8),*rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  std::__cxx11::string::string((string *)&local_88,(string *)Detail::unprintableString_abi_cxx11_);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_88);
  Catch::toString_abi_cxx11_(&local_68,(Catch *)rhs,value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"==",&local_21);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }